

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O0

void __thiscall sf::Transformable::rotate(Transformable *this,float angle)

{
  float angle_local;
  Transformable *this_local;
  
  setRotation(this,this->m_rotation + angle);
  return;
}

Assistant:

void Transformable::rotate(float angle)
{
    setRotation(m_rotation + angle);
}